

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.hpp
# Opt level: O1

void __thiscall piksel::BaseApp::BaseApp(BaseApp *this,int width,int height,string *title)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  this->_vptr_BaseApp = (_func_int **)&PTR__BaseApp_001aff78;
  this->width = width;
  this->height = height;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  pcVar2 = (title->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->title,pcVar2,pcVar2 + title->_M_string_length);
  this->sboSize = 0x36000;
  (this->shader).program = 0;
  p_Var1 = &(this->shader).uniforms._M_t._M_impl.super__Rb_tree_header;
  (this->shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->postfx_texture = 0;
  (this->postfx_shader).program = 0;
  p_Var1 = &(this->postfx_shader).uniforms._M_t._M_impl.super__Rb_tree_header;
  (this->postfx_shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->postfx_shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->postfx_shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->postfx_shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->postfx_shader).uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->stateStack).c.super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<piksel::State,_std::allocator<piksel::State>_>::_M_initialize_map
            ((_Deque_base<piksel::State,_std::allocator<piksel::State>_> *)&this->stateStack,0);
  (this->shapes).super__Vector_base<piksel::Shape,_std::allocator<piksel::Shape>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shapes).super__Vector_base<piksel::Shape,_std::allocator<piksel::Shape>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shaderRelevantStateVector).
  super__Vector_base<piksel::ShaderRelevantState,_std::allocator<piksel::ShaderRelevantState>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shapes).super__Vector_base<piksel::Shape,_std::allocator<piksel::Shape>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shaderRelevantStateVector).
  super__Vector_base<piksel::ShaderRelevantState,_std::allocator<piksel::ShaderRelevantState>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shaderRelevantStateVector).
  super__Vector_base<piksel::ShaderRelevantState,_std::allocator<piksel::ShaderRelevantState>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->devicePixelRatio = 1.0;
  return;
}

Assistant:

BaseApp(int width, int height, std::string title)
        : width(width)
        , height(height)
        , title(title)
        , sboSize(1024 * sizeof(State))
        , postfx_texture(0)
        , devicePixelRatio(1.0f) {
    }